

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignExtLowering.cpp
# Opt level: O3

void __thiscall wasm::SignExtLowering::~SignExtLowering(SignExtLowering *this)

{
  pointer pTVar1;
  
  pTVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>_>
           ).super_PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>.
           super_Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>::Task,_std::allocator<wasm::Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>
                                          .
                                          super_Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>::Task,_std::allocator<wasm::Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x130);
  return;
}

Assistant:

void lowerToShifts(Expression* value,
                     BinaryOp leftShift,
                     BinaryOp rightShift,
                     T originalBits) {
    // To sign-extend, we shift all the way left so the effective sign bit is
    // where the actual sign bit is. For example, when sign-extending i8, the
    // effective sign bit is at bit 8, and we shift it to the actual place of
    // the sign bit, which is 32 for i32 or 64 for i64. Then we do a signed
    // shift in the other direction, which fills with the proper bit all the
    // way back, so e.g.
    //
    //  0x000000ff  =(shift left)=>  0xff000000  =(shift right)=>  0xffffffff
    //
    T shiftBits = (sizeof(T) * 8) - originalBits;
    Builder builder(*getModule());
    replaceCurrent(builder.makeBinary(
      rightShift,
      builder.makeBinary(leftShift, value, builder.makeConst(shiftBits)),
      builder.makeConst(shiftBits)));
  }